

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_substruct_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,int32_t *ip,CTInfo flags)

{
  uint uVar1;
  CType *d_00;
  cTValue *local_f8;
  uint local_ec;
  int32_t iz;
  int32_t i;
  TValue *tv;
  CType *df;
  CTypeID id;
  CTInfo flags_local;
  int32_t *ip_local;
  GCtab *t_local;
  uint8_t *dp_local;
  CType *d_local;
  CTState *cts_local;
  CType *local_98;
  CType *local_68;
  
  df._0_4_ = (uint)d->sib;
  do {
    do {
      while( true ) {
        if ((uint)df == 0) {
          return;
        }
        d_00 = cts->tab + (uint)df;
        df._0_4_ = (uint)d_00->sib;
        if ((d_00->info >> 0x1c == 9) || (d_00->info >> 0x1c == 10)) break;
        local_98 = d_00;
        if ((d_00->info & 0xf0ff0000) == 0x80030000) {
          do {
            local_98 = cts->tab + (local_98->info & 0xffff);
          } while (local_98->info >> 0x1c == 8);
          cconv_substruct_tab(cts,local_98,dp + d_00->size,t,ip,flags);
        }
      }
      uVar1 = *ip;
    } while ((d_00->name).gcptr64 == 0);
    local_ec = uVar1;
    if (-1 < (int)uVar1) {
      while( true ) {
        if (local_ec < t->asize) {
          local_f8 = (cTValue *)((t->array).ptr64 + (long)(int)local_ec * 8);
        }
        else {
          local_f8 = lj_tab_getinth(t,local_ec);
        }
        _iz = local_f8;
        if ((local_f8 != (cTValue *)0x0) && (local_f8->u64 != 0xffffffffffffffff)) {
          *ip = local_ec + 1;
          goto LAB_00183086;
        }
        if (local_ec != 0) break;
        local_ec = 1;
      }
      if (uVar1 != 0) {
        return;
      }
      *ip = -1;
    }
    _iz = lj_tab_getstr(t,(GCstr *)(d_00->name).gcptr64);
    if ((_iz != (cTValue *)0x0) && (_iz->u64 != 0xffffffffffffffff)) {
LAB_00183086:
      local_68 = d_00;
      if (d_00->info >> 0x1c == 9) {
        do {
          local_68 = cts->tab + (local_68->info & 0xffff);
        } while (local_68->info >> 0x1c == 8);
        lj_cconv_ct_tv(cts,local_68,dp + d_00->size,_iz,flags);
      }
      else {
        lj_cconv_bf_tv(cts,d_00,dp + d_00->size,_iz);
      }
      if ((d->info & 0x800000) != 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void cconv_substruct_tab(CTState *cts, CType *d, uint8_t *dp,
				GCtab *t, int32_t *ip, CTInfo flags)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      TValue *tv;
      int32_t i = *ip, iz = i;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= 0) {
      retry:
	tv = (TValue *)lj_tab_getint(t, i);
	if (!tv || tvisnil(tv)) {
	  if (i == 0) { i = 1; goto retry; }  /* 1-based tables. */
	  if (iz == 0) { *ip = i = -1; goto tryname; }  /* Init named fields. */
	  break;  /* Stop at first nil. */
	}
	*ip = i + 1;
      } else {
      tryname:
	tv = (TValue *)lj_tab_getstr(t, gco2str(gcref(df->name)));
	if (!tv || tvisnil(tv)) continue;
      }
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, tv, flags);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, tv);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_tab(cts, ctype_rawchild(cts, df),
			  dp+df->size, t, ip, flags);
    }  /* Ignore all other entries in the chain. */
  }
}